

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  void *__src;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  run_container_t *run;
  array_container_t *container;
  uint8_t uVar11;
  long lVar12;
  char *buf_00;
  bool bVar13;
  bool bVar14;
  
  uVar6 = (ulong)ra->size;
  if ((long)uVar6 < 1) {
LAB_0010f8f8:
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    buf_00 = buf + 8;
    iVar5 = ra->size;
    iVar10 = iVar5 * 8 + 8;
    bVar3 = 1;
  }
  else {
    bVar13 = true;
    uVar7 = 1;
    do {
      uVar11 = ra->typecodes[uVar7 - 1];
      if (uVar11 == '\x04') {
        uVar11 = *(uint8_t *)((long)ra->containers[uVar7 - 1] + 8);
      }
      if (uVar11 == '\x03') break;
      bVar13 = uVar7 < uVar6;
      bVar14 = uVar7 != uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar14);
    if (!bVar13) goto LAB_0010f8f8;
    *(int32_t *)buf = ra->size * 0x10000 + -0xcfc5;
    iVar5 = ra->size + 7;
    iVar10 = ra->size + 0xe;
    if (-1 < iVar5) {
      iVar10 = iVar5;
    }
    uVar6 = (ulong)(uint)(iVar10 >> 3);
    __src = roaring_calloc(uVar6,1);
    iVar5 = ra->size;
    if (0 < iVar5) {
      uVar7 = 0;
      do {
        uVar11 = ra->typecodes[uVar7];
        if (uVar11 == '\x04') {
          uVar11 = *(uint8_t *)((long)ra->containers[uVar7] + 8);
        }
        if (uVar11 == '\x03') {
          pbVar1 = (byte *)((long)__src + (uVar7 >> 3 & 0x1fffffff));
          *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar7 & 7);
          iVar5 = ra->size;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)iVar5);
    }
    memcpy(buf + 4,__src,uVar6);
    buf_00 = buf + 4 + uVar6;
    roaring_free(__src);
    iVar5 = ra->size;
    iVar2 = iVar5 * 8;
    if (iVar5 < 4) {
      iVar2 = iVar5 * 4;
    }
    iVar10 = iVar2 + 4 + (iVar10 >> 3);
    bVar3 = 0;
  }
  if (0 < iVar5) {
    lVar12 = 0;
    lVar9 = 0;
    do {
      *(uint16_t *)(buf_00 + lVar9 * 4) = ra->keys[lVar9];
      run = (run_container_t *)ra->containers[lVar9];
      uVar11 = ra->typecodes[lVar9];
      if (uVar11 == '\x04') {
        uVar11 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar11 == '\x03') {
        iVar5 = run_container_cardinality(run);
        sVar4 = (short)iVar5;
      }
      else {
        sVar4 = (short)run->n_runs;
      }
      *(short *)(buf_00 + lVar9 * 4 + 2) = sVar4 + -1;
      lVar9 = lVar9 + 1;
      iVar5 = ra->size;
      lVar12 = lVar12 + 4;
    } while (lVar9 < iVar5);
    buf_00 = buf_00 + lVar12;
  }
  if (!(bool)(~bVar3 & iVar5 < 4)) {
    if (iVar5 < 1) goto LAB_0010fa43;
    lVar9 = 0;
    lVar12 = 0;
    do {
      *(int *)(buf_00 + lVar12 * 4) = iVar10;
      piVar8 = (int *)ra->containers[lVar12];
      uVar11 = ra->typecodes[lVar12];
      if (uVar11 == '\x04') {
        uVar11 = (uint8_t)piVar8[2];
        piVar8 = *(int **)piVar8;
      }
      if (uVar11 == '\x01') {
        iVar5 = 0x2000;
      }
      else if (uVar11 == '\x03') {
        iVar5 = *piVar8 * 4 + 2;
      }
      else {
        iVar5 = *piVar8 * 2;
      }
      iVar10 = iVar10 + iVar5;
      lVar12 = lVar12 + 1;
      iVar5 = ra->size;
      lVar9 = lVar9 + 4;
    } while (lVar12 < iVar5);
    buf_00 = buf_00 + lVar9;
  }
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      container = (array_container_t *)ra->containers[lVar9];
      uVar11 = ra->typecodes[lVar9];
      if (uVar11 == '\x04') {
        uVar11 = *(uint8_t *)&container->array;
        container = *(array_container_t **)container;
      }
      if (uVar11 == '\x03') {
        iVar5 = run_container_write((run_container_t *)container,buf_00);
      }
      else if (uVar11 == '\x02') {
        iVar5 = array_container_write(container,buf_00);
      }
      else {
        iVar5 = bitset_container_write((bitset_container_t *)container,buf_00);
      }
      buf_00 = buf_00 + iVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < ra->size);
  }
LAB_0010fa43:
  return (long)buf_00 - (long)buf;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((uint32_t)(ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)roaring_calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        roaring_free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(container_get_cardinality(ra->containers[k],
                                                             ra->typecodes[k]) -
                                   1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}